

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O3

void render_line_mode4(gba_ppu_t *ppu)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int x;
  DISPCNT_t DVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  ulong uVar12;
  uint8_t *puVar13;
  int iVar14;
  uint uVar15;
  ushort uVar16;
  byte bVar17;
  byte bVar18;
  ushort uVar19;
  ulong uVar20;
  uint uVar21;
  bool bVar22;
  _Bool bg_enabled [4];
  _Bool bg_top [6];
  byte local_9e [4];
  byte local_9a [4];
  byte local_96;
  byte local_95;
  byte local_94 [4];
  byte local_90;
  byte local_8f;
  ushort local_8e;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  ulong local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  gba_color_t (*local_50) [240];
  color_t (*local_48) [240];
  ulong local_40;
  ulong local_38;
  
  DVar5 = ppu->DISPCNT;
  if (((uint)DVar5 >> 0xc & 1) != 0) {
    render_obj(ppu);
    DVar5._2_2_ = 0;
    DVar5.raw = (ppu->DISPCNT).raw;
  }
  if (((uint)DVar5 >> 10 & 1) == 0) {
    lVar7 = 0;
    do {
      ppu->bgbuf[2][lVar7].raw = *(ushort *)ppu->pram | 0x8000;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0xf0);
  }
  else {
    uVar16 = ppu->y;
    lVar7 = 0;
    do {
      puVar13 = ppu->vram + (ulong)uVar16 * 0xf0;
      if (((uint)ppu->DISPCNT & 0x10) != 0) {
        puVar13 = ppu->vram + (ulong)uVar16 * 0xf0 + 0xa000;
      }
      if ((ulong)puVar13[lVar7] == 0) {
        uVar19 = *(ushort *)ppu->pram | 0x8000;
      }
      else {
        uVar19 = *(ushort *)(ppu->pram + (ulong)puVar13[lVar7] * 2) & 0x7fff;
      }
      ppu->bgbuf[2][lVar7].raw = uVar19;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0xf0);
  }
  uVar20 = 0;
  dbg_line_drawn();
  refresh_background_priorities(ppu);
  local_74 = (ppu->BLDALPHA).raw & 0x1f;
  local_70 = (ppu->BLDALPHA).raw >> 8 & 0x1f;
  local_5c = (ppu->BLDY).raw & 0x1f;
  if (0xf < (ushort)local_5c) {
    local_5c = 0x10;
  }
  bVar11 = (byte)((ppu->DISPCNT).raw >> 8);
  local_9e[0] = bVar11 & 1;
  local_9e[1] = bVar11 >> 1 & 1;
  local_9e[2] = bVar11 >> 2 & 1;
  local_9e[3] = bVar11 >> 3 & 1;
  bVar11 = (byte)(ppu->BLDCNT).raw;
  local_94[0] = bVar11 & 1;
  local_94[1] = bVar11 >> 1 & 1;
  local_94[2] = bVar11 >> 2 & 1;
  local_94[3] = bVar11 >> 3 & 1;
  local_90 = bVar11 >> 4 & 1;
  local_8f = bVar11 >> 5 & 1;
  bVar11 = (byte)((ppu->BLDCNT).raw >> 8);
  local_9a[0] = bVar11 & 1;
  local_9a[1] = bVar11 >> 1 & 1;
  local_9a[2] = bVar11 >> 2 & 1;
  local_9a[3] = bVar11 >> 3 & 1;
  local_96 = bVar11 >> 4 & 1;
  local_95 = bVar11 >> 5 & 1;
  local_8e = *(ushort *)ppu->pram;
  local_40 = (ulong)ppu->y;
  local_50 = ppu->bgbuf;
  uVar9 = (uint)(byte)(0x10 - (char)local_5c);
  if (0xf < (ushort)local_70) {
    local_70 = 0x10;
  }
  if (0xf < (ushort)local_74) {
    local_74 = 0x10;
  }
  local_48 = ppu->screen;
  uVar12 = local_40;
  do {
    uVar16 = (ushort)uVar12;
    if ((byte)(ppu->WIN0H).raw < uVar20 || uVar20 < (ppu->WIN0H).raw >> 8) {
      bVar22 = false;
    }
    else {
      bVar22 = uVar16 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar16;
    }
    if ((byte)(ppu->WIN1H).raw < uVar20 || uVar20 < (ppu->WIN1H).raw >> 8) {
      bVar8 = false;
    }
    else {
      bVar8 = uVar16 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar16;
    }
    uVar16 = (ppu->DISPCNT).raw;
    bVar11 = (byte)(uVar16 >> 8);
    if ((bVar11 >> 5 & 1 & bVar22) == 1) {
      bVar11 = *(byte *)&ppu->WININ;
LAB_00117f06:
      uVar19 = (ushort)(bVar11 >> 5);
    }
    else {
      if ((bVar11 >> 6 & 1 & bVar8) == 1) {
        uVar19 = (ppu->WININ).raw;
      }
      else {
        if (((short)uVar16 < 0 & ppu->obj_window[uVar20]) != 1) {
          uVar19 = 1;
          if ((uVar16 & 0x6000) != 0 && (bVar22 == false && bVar8 == false)) {
            bVar11 = *(byte *)&ppu->WINOUT;
            goto LAB_00117f06;
          }
          goto LAB_00117f4c;
        }
        uVar19 = (ppu->WINOUT).raw;
      }
      uVar19 = uVar19 >> 0xd;
    }
LAB_00117f4c:
    uVar16 = (ppu->BLDCNT).raw;
    local_58 = uVar16 >> 6 & 3;
    local_6c = (uint)uVar16;
    uVar3 = local_6c;
    local_54 = uVar16 & 0xc0;
    uVar4 = local_54;
    local_7c = (black.raw & 0x1f) * local_5c;
    local_80 = (black.raw >> 5 & 0x1f) * local_5c;
    local_78 = (black.raw >> 10 & 0x1f) * local_5c;
    local_88 = (white.raw & 0x1f) * local_5c;
    local_8c = (white.raw >> 5 & 0x1f) * local_5c;
    local_84 = (white.raw >> 10 & 0x1f) * local_5c;
    iVar14 = 5;
    uVar12 = 3;
    local_38 = (ulong)local_58;
    uVar15 = (uint)local_8e;
    uVar10 = (uint)local_8e;
    local_68 = uVar20;
    do {
      iVar2 = background_priorities[uVar12];
      bVar11 = local_9a[iVar14];
      local_6c._0_1_ = (char)uVar16;
      local_6c = uVar3;
      local_54 = uVar4;
      if ((uVar19 & 1) == 0) {
        bVar18 = (char)local_6c < '\0' | bVar11;
        uVar6 = (uint)local_50[iVar2][uVar20].raw;
        bVar17 = -1 < (short)local_50[iVar2][uVar20].raw & local_9e[iVar2];
joined_r0x00118166:
        uVar21 = uVar10;
        if (bVar17 != 0) {
          uVar21 = uVar6;
          iVar14 = iVar2;
          uVar15 = uVar6;
        }
      }
      else {
        local_54._0_2_ = (short)(uVar16 & 0xc0);
        bVar18 = (char)local_6c < '\0' | bVar11;
        uVar1 = local_50[iVar2][uVar20].raw;
        uVar6 = (uint)uVar1;
        bVar17 = -1 < (short)uVar1 & local_9e[iVar2];
        if (((bVar17 != 1) || (local_94[iVar2] == 0)) ||
           ((char)local_6c >= '\0' && ((short)local_54 == 0x40 & bVar11) == 0))
        goto joined_r0x00118166;
        uVar21 = (uint)uVar1;
        switch(local_58) {
        case 0:
          render_line_mode4_cold_2();
          goto switchD_001182c9_caseD_1184b7;
        case 1:
          uVar15 = (uVar21 & 0x1f) * local_74 + (uVar10 & 0x1f) * local_70 >> 4;
          if (0x1e < (ushort)uVar15) {
            uVar15 = 0x1f;
          }
          uVar6 = (uVar1 >> 5 & 0x1f) * local_74 + (uVar10 >> 5 & 0x1f) * local_70 >> 4;
          if (0x1e < (ushort)uVar6) {
            uVar6 = 0x1f;
          }
          uVar10 = (uVar1 >> 10) * local_74 + (uVar10 >> 10 & 0x1f) * local_70 >> 4;
          if (0x1e < (ushort)uVar10) {
            uVar10 = 0x1f;
          }
          uVar15 = uVar10 << 10 | uVar6 << 5 | uVar15;
          iVar14 = iVar2;
          goto LAB_0011826a;
        case 2:
          uVar10 = (uVar6 & 0x1f) * uVar9 + local_88 >> 4;
          if (0x1e < uVar10) {
            uVar10 = 0x1f;
          }
          uVar15 = (uVar1 >> 5 & 0x1f) * uVar9 + local_8c >> 4;
          if (0x1e < uVar15) {
            uVar15 = 0x1f;
          }
          uVar6 = (uVar1 >> 10) * uVar9 + local_84;
          break;
        case 3:
          uVar10 = (uVar6 & 0x1f) * uVar9 + local_7c >> 4;
          if (0x1e < uVar10) {
            uVar10 = 0x1f;
          }
          uVar15 = (uVar1 >> 5 & 0x1f) * uVar9 + local_80 >> 4;
          if (0x1e < uVar15) {
            uVar15 = 0x1f;
          }
          uVar6 = (uVar1 >> 10) * uVar9 + local_78;
        }
        uVar6 = uVar6 >> 4;
        if (0x1e < uVar6) {
          uVar6 = 0x1f;
        }
        uVar15 = uVar10 | uVar6 << 10 | uVar15 << 5;
        iVar14 = iVar2;
      }
LAB_0011826a:
      uVar10 = uVar21;
      if (uVar12 == ppu->obj_priorities[uVar20]) {
        uVar1 = ppu->objbuf[uVar20].raw;
        bVar22 = -1 < (short)uVar1;
        uVar6 = (uint)uVar1;
        if (bVar22) {
          uVar15 = uVar6;
        }
        if (bVar22) {
          uVar10 = uVar6;
          iVar14 = 4;
        }
        if ((bVar22 & ppu->obj_alpha[uVar20] & bVar18) == 1) {
          if (bVar11 == 0) {
            switch(local_58) {
            case 0:
switchD_001182c9_caseD_1184b7:
              render_line_mode4_cold_1();
            case 1:
              goto switchD_001182c9_caseD_1182cb;
            case 2:
              uVar10 = (uVar1 & 0x1f) * uVar9 + local_88 >> 4;
              if (0x1e < uVar10) {
                uVar10 = 0x1f;
              }
              uVar15 = (uVar1 >> 5 & 0x1f) * uVar9 + local_8c >> 4;
              if (0x1e < uVar15) {
                uVar15 = 0x1f;
              }
              uVar6 = (uVar1 >> 10) * uVar9 + local_84;
              break;
            case 3:
              uVar10 = (uVar6 & 0x1f) * uVar9 + local_7c >> 4;
              if (0x1e < uVar10) {
                uVar10 = 0x1f;
              }
              uVar15 = (uVar1 >> 5 & 0x1f) * uVar9 + local_80 >> 4;
              if (0x1e < uVar15) {
                uVar15 = 0x1f;
              }
              uVar6 = (uVar1 >> 10) * uVar9 + local_78;
            }
            uVar6 = uVar6 >> 4;
            if (0x1e < uVar6) {
              uVar6 = 0x1f;
            }
            uVar15 = uVar10 | uVar6 << 10 | uVar15 << 5;
          }
          else {
switchD_001182c9_caseD_1182cb:
            uVar10 = (uVar1 & 0x1f) * local_74 + (uVar21 & 0x1f) * local_70 >> 4;
            if (0x1e < (ushort)uVar10) {
              uVar10 = 0x1f;
            }
            uVar15 = (uVar1 >> 5 & 0x1f) * local_74 + (uVar21 >> 5 & 0x1f) * local_70 >> 4;
            if (0x1e < (ushort)uVar15) {
              uVar15 = 0x1f;
            }
            uVar6 = (uVar1 >> 10) * local_74 + (uVar21 >> 10 & 0x1f) * local_70 >> 4;
            if (0x1e < (ushort)uVar6) {
              uVar6 = 0x1f;
            }
            uVar15 = uVar6 << 10 | uVar15 << 5 | uVar10;
          }
          iVar14 = 4;
          uVar10 = (uint)uVar1;
        }
      }
      bVar22 = uVar12 != 0;
      uVar12 = uVar12 - 1;
    } while (bVar22);
    local_48[local_40][uVar20].a = 0xff;
    local_48[local_40][uVar20].r = ((byte)uVar15 & 7) + (byte)uVar15 * '\b';
    bVar11 = (byte)((uVar15 & 0xffff) >> 5);
    local_48[local_40][uVar20].g = (bVar11 & 7) + bVar11 * '\b';
    bVar11 = (byte)((uVar15 & 0xffff) >> 10);
    local_48[local_40][uVar20].b = (bVar11 & 7) + bVar11 * '\b';
    uVar20 = uVar20 + 1;
    uVar12 = local_40;
    if (uVar20 == 0xf0) {
      return;
    }
  } while( true );
}

Assistant:

void render_line_mode4(gba_ppu_t* ppu) {
    if (ppu->DISPCNT.screen_display_obj) {
        render_obj(ppu);
    }
    if (ppu->DISPCNT.screen_display_bg2) {
        for (int x = 0; x < GBA_SCREEN_X; x++) {
            int offset = x + (ppu->y * GBA_SCREEN_X);
            int index = ppu->DISPCNT.display_frame_select * 0xA000 + offset;
            int tile = ppu->vram[index];
            if (tile == 0) {
                ppu->bgbuf[2][x].raw = half_from_byte_array(ppu->pram, 0);
                ppu->bgbuf[2][x].transparent = true;
            } else {
                ppu->bgbuf[2][x].raw = half_from_byte_array(ppu->pram, (0x20 * PALETTE_BANK_BACKGROUND + 2 * tile)) & 0x7FFF;
                ppu->bgbuf[2][x].transparent = false;
            }
        }
    } else {
        for (int x = 0; x < GBA_SCREEN_X; x++) {
            ppu->bgbuf[2][x].raw = half_from_byte_array(ppu->pram, 0);
            ppu->bgbuf[2][x].transparent = true;
        }
    }

    dbg_line_drawn();
    refresh_background_priorities(ppu);
    merge_bgs(ppu);
}